

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O1

void Gia_ManCreateValueRefs(Gia_Man_t *p)

{
  ulong uVar1;
  ulong uVar2;
  uint *puVar3;
  uint uVar4;
  int *piVar5;
  
  uVar2 = (ulong)(uint)p->nObjs;
  if ((0 < p->nObjs) && (p->pObjs != (Gia_Obj_t *)0x0)) {
    puVar3 = &p->pObjs->Value;
    do {
      *puVar3 = 0;
      uVar1 = *(ulong *)(puVar3 + -2);
      uVar4 = (uint)(uVar1 & 0x1fffffff);
      if ((uVar1 & 0x1fffffff) == 0x1fffffff || (int)uVar1 < 0) {
        if ((int)uVar1 < 0 && uVar4 != 0x1fffffff) goto LAB_0073f39a;
      }
      else {
        piVar5 = (int *)((long)puVar3 + (ulong)(uVar4 << 2) * -3);
        *piVar5 = *piVar5 + 1;
        uVar4 = (uint)(uVar1 >> 0x20) & 0x1fffffff;
LAB_0073f39a:
        piVar5 = (int *)((long)puVar3 + (ulong)(uVar4 << 2) * -3);
        *piVar5 = *piVar5 + 1;
      }
      puVar3 = puVar3 + 3;
      uVar2 = uVar2 - 1;
    } while (uVar2 != 0);
  }
  return;
}

Assistant:

void Gia_ManCreateValueRefs( Gia_Man_t * p )  
{
    Gia_Obj_t * pObj;
    int i;
    Gia_ManForEachObj( p, pObj, i )
    {
        pObj->Value = 0;
        if ( Gia_ObjIsAnd(pObj) )
        {
            Gia_ObjFanin0(pObj)->Value++;
            Gia_ObjFanin1(pObj)->Value++;
        }
        else if ( Gia_ObjIsCo(pObj) )
            Gia_ObjFanin0(pObj)->Value++;
    }
}